

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssi.cpp
# Opt level: O0

void __thiscall pg::SSISolver::compute_vals_ll(SSISolver *this,int side)

{
  int *piVar1;
  int *piVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  int **local_d8;
  bitset *local_d0;
  uint local_c0;
  char local_b9;
  int from;
  int local_a4;
  int *piStack_a0;
  int s_1;
  int *val_v;
  uint local_84;
  undefined1 local_80 [4];
  int v_1;
  int local_6c;
  size_t sStack_68;
  int s;
  size_t v;
  int **local_58;
  int **S;
  bitset *H;
  SSISolver *pSStack_40;
  int side_local;
  SSISolver *this_local;
  uintqueue *local_30;
  uint local_24;
  uintqueue *local_20;
  uintqueue *local_18;
  uintqueue *local_10;
  
  if (side == 0) {
    local_d0 = &this->halt0;
  }
  else {
    local_d0 = &this->halt1;
  }
  S = (int **)local_d0;
  if (side == 0) {
    local_d8 = &this->str0;
  }
  else {
    local_d8 = &this->str1;
  }
  local_58 = local_d8;
  H._4_4_ = side;
  pSStack_40 = this;
  bitset::operator=(&this->C,&this->G);
  piVar1 = this->first_in;
  piVar2 = this->first_in;
  lVar5 = Solver::nodecount(&this->super_Solver);
  v._7_1_ = 0xff;
  std::fill<int*,char>(piVar1,piVar2 + lVar5,(char *)((long)&v + 7));
  for (sStack_68 = bitset::find_first(&this->G); sStack_68 != 0xffffffffffffffff;
      sStack_68 = bitset::find_next(&this->G,sStack_68)) {
    local_6c = (*local_58)[sStack_68];
    bitset::operator[]((bitset *)local_80,(size_t)S);
    bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_80);
    uVar4 = (uint)sStack_68;
    if (bVar3) {
      local_20 = &this->Q;
      iVar6 = (this->Q).pointer;
      (this->Q).pointer = iVar6 + 1;
      local_20->queue[iVar6] = uVar4;
      local_24 = uVar4;
    }
    else {
      this->next_in[sStack_68] = this->first_in[local_6c];
      this->first_in[local_6c] = uVar4;
    }
  }
  while (local_18 = &this->Q, (this->Q).pointer != 0) {
    local_10 = &this->Q;
    iVar6 = (this->Q).pointer + -1;
    (this->Q).pointer = iVar6;
    local_84 = local_10->queue[iVar6];
    bitset::operator[]((bitset *)&val_v,(size_t)&this->C);
    bitset::reference::operator=((reference *)&val_v,false);
    piStack_a0 = this->val + (int)(this->k * local_84);
    local_a4 = (*local_58)[(int)local_84];
    bitset::operator[]((bitset *)&from,(size_t)S);
    bVar3 = bitset::reference::operator_cast_to_bool((reference *)&from);
    if (bVar3) {
      local_b9 = '\0';
      std::fill<int*,char>(piStack_a0,piStack_a0 + this->k,&local_b9);
    }
    else {
      std::copy<int*,int*>
                (this->val + this->k * local_a4,this->val + this->k * (local_a4 + 1),piStack_a0);
    }
    piVar1 = piStack_a0;
    iVar6 = Solver::priority(&this->super_Solver,local_84);
    piVar1[iVar6] = piVar1[iVar6] + 1;
    for (local_c0 = this->first_in[(int)local_84]; local_c0 != 0xffffffff;
        local_c0 = this->next_in[(int)local_c0]) {
      local_30 = &this->Q;
      this_local._4_4_ = local_c0;
      iVar6 = (this->Q).pointer;
      (this->Q).pointer = iVar6 + 1;
      local_30->queue[iVar6] = local_c0;
    }
  }
  return;
}

Assistant:

void
SSISolver::compute_vals_ll(int side)
{
    auto & H = side == 0 ? halt0 : halt1;
    auto & S = side == 0 ? str0 : str1;

    // set all vertices in G to "on cycle"
    C = G;

    // find all halting vertices and set the linked list of in edges
    std::fill(first_in, first_in+nodecount(), '\xff');
    for (auto v = G.find_first(); v != bitset::npos; v = G.find_next(v)) {
        int s = S[v];
        if (H[s]) {
            // successor of v is halted
            Q.push(v);
        } else {
            // successor of v is not halted
            next_in[v] = first_in[s];
            first_in[s] = v;
        }
    }

    // walk the finite paths
    while (Q.nonempty()) {
        int v = Q.pop();

        // mark as not on a cycle
        C[v] = false;

        // set valuation
        int *val_v = val + k*v;
        int s = S[v];
        if (H[s]) {
            std::fill(val_v, val_v+k, '\x00');
        } else {
            std::copy(val+k*s, val+k*(s+1), val_v);
        }
        val_v[priority(v)]++;

        // add predecessors
        int from = first_in[v];
        while (from != -1) {
            Q.push(from);
            from = next_in[from];
        }
    }
}